

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  char cVar7;
  char **fmt;
  bool bVar8;
  int iVar9;
  _Any_data *p_Var10;
  char **args;
  ulong uVar11;
  char *pcVar12;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  filenames_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  filenames_01;
  undefined8 uStack_1590;
  bool local_157b;
  bool toPly;
  bool format;
  char **argv_local;
  allocator<char> local_156c;
  allocator<char> local_156b;
  allocator<char> local_156a;
  allocator<char> local_1569;
  allocator<char> local_1568;
  allocator<char> local_1567;
  allocator<char> local_1566;
  allocator<char> local_1565;
  allocator<char> local_1564;
  allocator<char> local_1563;
  allocator<char> local_1562;
  allocator<char> local_1561;
  allocator<char> local_1560;
  allocator<char> local_155f;
  allocator<char> local_155e;
  allocator<char> local_155d;
  allocator<char> local_155c;
  allocator<char> local_155b;
  allocator<char> local_155a;
  allocator<char> local_1559;
  string local_1558;
  vector<float,_std::allocator<float>_> c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  undefined1 local_14f8 [32];
  string pixelBounds;
  string pixelMaterial;
  string pixel;
  _Any_data local_1478;
  code *local_1468;
  code *local_1460;
  string renderCoordSys;
  _Any_data local_1438;
  code *local_1428;
  code *local_1420;
  undefined1 local_1418 [32];
  _Any_data local_13f8;
  code *local_13e8;
  code *local_13e0;
  _Any_data local_13d8;
  code *local_13c8;
  code *local_13c0;
  _Any_data local_13b8;
  code *local_13a8;
  code *local_13a0;
  _Any_data local_1398;
  code *local_1388;
  code *local_1380;
  _Any_data local_1378;
  code *local_1368;
  code *local_1360;
  _Any_data local_1358;
  code *local_1348;
  code *local_1340;
  _Any_data local_1338;
  code *local_1328;
  code *local_1320;
  _Any_data local_1318;
  code *local_1308;
  code *local_1300;
  _Any_data local_12f8;
  code *local_12e8;
  code *local_12e0;
  _Any_data local_12d8;
  code *local_12c8;
  code *local_12c0;
  _Any_data local_12b8;
  code *local_12a8;
  code *local_12a0;
  _Any_data local_1298;
  code *local_1288;
  code *local_1280;
  _Any_data local_1278;
  code *local_1268;
  code *local_1260;
  _Any_data local_1258;
  code *local_1248;
  code *local_1240;
  _Any_data local_1238;
  code *local_1228;
  code *local_1220;
  _Any_data local_1218;
  code *local_1208;
  code *local_1200;
  _Any_data local_11f8;
  code *local_11e8;
  code *local_11e0;
  _Any_data local_11d8;
  code *local_11c8;
  code *local_11c0;
  _Any_data local_11b8;
  code *local_11a8;
  code *local_11a0;
  _Any_data local_1198;
  code *local_1188;
  code *local_1180;
  _Any_data local_1178;
  code *local_1168;
  code *local_1160;
  _Any_data local_1158;
  code *local_1148;
  code *local_1140;
  string logLevel;
  PBRTOptions options;
  string local_1010;
  string local_ff0;
  string local_fd0;
  string local_fb0;
  string local_f90;
  string local_f70;
  string local_f50;
  string local_f30;
  string local_f10;
  string local_ef0;
  string local_ed0;
  string local_eb0;
  string local_e90;
  string local_e70;
  string local_e50;
  string local_e30;
  string cropWindow;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_df0;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_de0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_dd8;
  undefined1 local_dd0 [64];
  undefined1 local_d90 [48];
  undefined1 local_d60 [32];
  polymorphic_allocator<pbrt::ParsedParameter_*> local_d40;
  
  options.imageFile._M_dataplus._M_p = (pointer)&options.imageFile.field_2;
  options.mseReferenceImage._M_dataplus._M_p = (pointer)&options.mseReferenceImage.field_2;
  options.mseReferenceOutput._M_dataplus._M_p = (pointer)&options.mseReferenceOutput.field_2;
  filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  options.super_BasicPBRTOptions.useGPU = false;
  options.super_BasicPBRTOptions.seed = 0;
  options.super_BasicPBRTOptions.quiet = false;
  options.super_BasicPBRTOptions.disablePixelJitter = false;
  options.super_BasicPBRTOptions.disableWavelengthJitter = false;
  options.super_BasicPBRTOptions.forceDiffuse = false;
  options.super_BasicPBRTOptions.renderingSpace = CameraWorld;
  options.nThreads = 0;
  options.logLevel = Error;
  options.writePartialImages = false;
  options.recordPixelStatistics = false;
  options.pixelSamples.set = false;
  options.gpuDevice.set = false;
  options.quickRender = false;
  options.upgrade = false;
  options.imageFile._M_string_length = 0;
  options.imageFile.field_2._M_local_buf[0] = '\0';
  options.mseReferenceImage._M_string_length = 0;
  options.mseReferenceImage.field_2._M_local_buf[0] = '\0';
  options.mseReferenceOutput._M_string_length = 0;
  options.mseReferenceOutput.field_2._M_local_buf[0] = '\0';
  options.debugStart._M_dataplus._M_p = (pointer)&options.debugStart.field_2;
  options.displayServer._M_dataplus._M_p = (pointer)&options.displayServer.field_2;
  filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  options.debugStart._M_string_length = 0;
  options.debugStart.field_2._M_local_buf[0] = '\0';
  options.displayServer._M_string_length = 0;
  options.displayServer.field_2._M_local_buf[0] = '\0';
  options.cropWindow.set = false;
  options.pixelBounds.set = false;
  options.pixelMaterial.set = false;
  argv_local = argv;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&logLevel,"error",(allocator<char> *)&cropWindow);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&renderCoordSys,"cameraworld",(allocator<char> *)&cropWindow);
  format = false;
  toPly = false;
  argv_local = argv_local + 1;
  while( true ) {
    pcVar12 = *argv_local;
    if (pcVar12 == (char *)0x0) break;
    if (*pcVar12 == '-') {
      pixelBounds._M_dataplus._M_p = (pointer)&pixelBounds.field_2;
      cropWindow._M_dataplus._M_p = (pointer)&cropWindow.field_2;
      pixel._M_dataplus._M_p = (pointer)&pixel.field_2;
      pixelMaterial._M_dataplus._M_p = (pointer)&pixelMaterial.field_2;
      cropWindow._M_string_length = 0;
      pixelBounds._M_string_length = 0;
      pixel._M_string_length = 0;
      cropWindow.field_2._M_local_buf[0] = '\0';
      pixelBounds.field_2._M_local_buf[0] = '\0';
      pixel.field_2._M_local_buf[0] = '\0';
      pixelMaterial._M_string_length = 0;
      pixelMaterial.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1558,"cropwindow",(allocator<char> *)&c);
      local_1158._M_unused._M_object = (void *)0x0;
      local_1158._8_8_ = 0;
      local_1140 = std::
                   _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                   ::_M_invoke;
      local_1148 = std::
                   _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                   ::_M_manager;
      bVar8 = pbrt::ParseArg<std::__cxx11::string*>
                        (&argv_local,&local_1558,&cropWindow,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_1158);
      std::_Function_base::~_Function_base((_Function_base *)&local_1158);
      std::__cxx11::string::~string((string *)&local_1558);
      if (!bVar8) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1558,"pixel",(allocator<char> *)&c);
        local_1178._M_unused._M_object = (void *)0x0;
        local_1178._8_8_ = 0;
        local_1160 = std::
                     _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                     ::_M_invoke;
        local_1168 = std::
                     _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                     ::_M_manager;
        bVar8 = pbrt::ParseArg<std::__cxx11::string*>
                          (&argv_local,&local_1558,&pixel,
                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)&local_1178);
        std::_Function_base::~_Function_base((_Function_base *)&local_1178);
        std::__cxx11::string::~string((string *)&local_1558);
        if (bVar8) {
          str_00._M_str = pixel._M_dataplus._M_p;
          str_00._M_len = pixel._M_string_length;
          pbrt::SplitStringToInts((vector<int,_std::allocator<int>_> *)&c,str_00,',');
          if ((long)c.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)c.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start == 8) {
            local_1558._M_dataplus._M_p =
                 *(pointer *)
                  c.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
            local_1558._M_string_length =
                 CONCAT44((int)c.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start[1] + 1,
                          (int)*c.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start + 1);
            pstd::optional<pbrt::Bounds2<int>_>::operator=
                      (&options.pixelBounds,(Bounds2<int> *)&local_1558);
LAB_0025577c:
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&c);
            goto LAB_00255784;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1558,"Didn\'t find two values after --pixel",
                     (allocator<char> *)local_14f8);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1558,"pixelbounds",(allocator<char> *)&c);
          local_1198._M_unused._M_object = (void *)0x0;
          local_1198._8_8_ = 0;
          local_1180 = std::
                       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                       ::_M_invoke;
          local_1188 = std::
                       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                       ::_M_manager;
          bVar8 = pbrt::ParseArg<std::__cxx11::string*>
                            (&argv_local,&local_1558,&pixelBounds,
                             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                              *)&local_1198);
          std::_Function_base::~_Function_base((_Function_base *)&local_1198);
          std::__cxx11::string::~string((string *)&local_1558);
          if (bVar8) {
            str_01._M_str = pixelBounds._M_dataplus._M_p;
            str_01._M_len = pixelBounds._M_string_length;
            pbrt::SplitStringToInts((vector<int,_std::allocator<int>_> *)&c,str_01,',');
            if ((long)c.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)c.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x10) {
              fVar1 = *c.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
              fVar2 = c.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[1];
              fVar3 = c.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[2];
              fVar4 = c.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[3];
              fVar5 = fVar1;
              if ((int)fVar2 < (int)fVar1) {
                fVar5 = fVar2;
              }
              fVar6 = fVar3;
              if ((int)fVar4 < (int)fVar3) {
                fVar6 = fVar4;
              }
              local_1558._M_dataplus._M_p = (pointer)CONCAT44(fVar6,fVar5);
              if ((int)fVar2 < (int)fVar1) {
                fVar2 = fVar1;
              }
              if ((int)fVar4 < (int)fVar3) {
                fVar4 = fVar3;
              }
              local_1558._M_string_length = CONCAT44(fVar4,fVar2);
              pstd::optional<pbrt::Bounds2<int>_>::operator=
                        (&options.pixelBounds,(Bounds2<int> *)&local_1558);
              goto LAB_0025577c;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1558,"Didn\'t find four integer values after --pixelbounds",
                       (allocator<char> *)local_14f8);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1558,"pixelmaterial",(allocator<char> *)&c);
            local_11b8._M_unused._M_object = (void *)0x0;
            local_11b8._8_8_ = 0;
            local_11a0 = std::
                         _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                         ::_M_invoke;
            local_11a8 = std::
                         _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                         ::_M_manager;
            bVar8 = pbrt::ParseArg<std::__cxx11::string*>
                              (&argv_local,&local_1558,&pixelMaterial,
                               (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                *)&local_11b8);
            std::_Function_base::~_Function_base((_Function_base *)&local_11b8);
            std::__cxx11::string::~string((string *)&local_1558);
            if (!bVar8) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1558,"debugstart",&local_1559);
              local_1478._M_unused._M_object = (void *)0x0;
              local_1478._8_8_ = 0;
              local_1460 = std::
                           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                           ::_M_invoke;
              local_1468 = std::
                           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                           ::_M_manager;
              bVar8 = pbrt::ParseArg<std::__cxx11::string*>
                                (&argv_local,&local_1558,&options.debugStart,
                                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                  *)&local_1478);
              if (!bVar8) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&c,"disable-pixel-jitter",&local_155a);
                local_1438._M_unused._M_object = (void *)0x0;
                local_1438._8_8_ = 0;
                local_1420 = std::
                             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                             ::_M_invoke;
                local_1428 = std::
                             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                             ::_M_manager;
                bVar8 = pbrt::ParseArg<bool*>
                                  (&argv_local,(string *)&c,
                                   &options.super_BasicPBRTOptions.disablePixelJitter,
                                   (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                    *)&local_1438);
                if (!bVar8) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_14f8,"disable-wavelength-jitter",&local_155b);
                  local_11d8._M_unused._M_object = (void *)0x0;
                  local_11d8._8_8_ = 0;
                  local_11c0 = std::
                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                               ::_M_invoke;
                  local_11c8 = std::
                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                               ::_M_manager;
                  p_Var10 = &local_11d8;
                  bVar8 = pbrt::ParseArg<bool*>
                                    (&argv_local,(string *)local_14f8,
                                     &options.super_BasicPBRTOptions.disableWavelengthJitter,
                                     (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                      *)p_Var10);
                  args = (char **)CONCAT71((int7)((ulong)p_Var10 >> 8),1);
                  if (!bVar8) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)local_1418,"display-server",&local_155c);
                    local_11f8._M_unused._M_object = (void *)0x0;
                    local_11f8._8_8_ = 0;
                    local_11e0 = std::
                                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                 ::_M_invoke;
                    local_11e8 = std::
                                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                 ::_M_manager;
                    p_Var10 = &local_11f8;
                    bVar8 = pbrt::ParseArg<std::__cxx11::string*>
                                      (&argv_local,(string *)local_1418,&options.displayServer,
                                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                        *)p_Var10);
                    local_157b = true;
                    if (!bVar8) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_e50,"force-diffuse",&local_155d);
                      local_1218._M_unused._M_object = (void *)0x0;
                      local_1218._8_8_ = 0;
                      local_1200 = std::
                                   _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                   ::_M_invoke;
                      local_1208 = std::
                                   _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                   ::_M_manager;
                      p_Var10 = &local_1218;
                      bVar8 = pbrt::ParseArg<bool*>
                                        (&argv_local,&local_e50,
                                         &options.super_BasicPBRTOptions.forceDiffuse,
                                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                          *)p_Var10);
                      local_157b = true;
                      if (!bVar8) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_e70,"format",&local_155e);
                        local_1238._M_unused._M_object = (void *)0x0;
                        local_1238._8_8_ = 0;
                        local_1220 = std::
                                     _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                     ::_M_invoke;
                        local_1228 = std::
                                     _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                     ::_M_manager;
                        p_Var10 = &local_1238;
                        bVar8 = pbrt::ParseArg<bool*>
                                          (&argv_local,&local_e70,&format,
                                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                            *)p_Var10);
                        local_157b = true;
                        if (!bVar8) {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_e90,"log-level",&local_155f);
                          local_1258._M_unused._M_object = (void *)0x0;
                          local_1258._8_8_ = 0;
                          local_1240 = std::
                                       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                       ::_M_invoke;
                          local_1248 = std::
                                       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                       ::_M_manager;
                          p_Var10 = &local_1258;
                          bVar8 = pbrt::ParseArg<std::__cxx11::string*>
                                            (&argv_local,&local_e90,&logLevel,
                                             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                              *)p_Var10);
                          local_157b = true;
                          if (!bVar8) {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_eb0,"mse-reference-image",&local_1560);
                            local_1278._M_unused._M_object = (void *)0x0;
                            local_1278._8_8_ = 0;
                            local_1260 = std::
                                         _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                         ::_M_invoke;
                            local_1268 = std::
                                         _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                         ::_M_manager;
                            p_Var10 = &local_1278;
                            bVar8 = pbrt::ParseArg<std::__cxx11::string*>
                                              (&argv_local,&local_eb0,&options.mseReferenceImage,
                                               (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                *)p_Var10);
                            local_157b = true;
                            if (!bVar8) {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_ed0,"mse-reference-out",&local_1561);
                              local_1298._M_unused._M_object = (void *)0x0;
                              local_1298._8_8_ = 0;
                              local_1280 = std::
                                           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                           ::_M_invoke;
                              local_1288 = std::
                                           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                           ::_M_manager;
                              p_Var10 = &local_1298;
                              bVar8 = pbrt::ParseArg<std::__cxx11::string*>
                                                (&argv_local,&local_ed0,&options.mseReferenceOutput,
                                                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)p_Var10);
                              local_157b = true;
                              if (!bVar8) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_ef0,"nthreads",&local_1562);
                                local_12b8._M_unused._M_object = (void *)0x0;
                                local_12b8._8_8_ = 0;
                                local_12a0 = std::
                                             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                             ::_M_invoke;
                                local_12a8 = std::
                                             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                             ::_M_manager;
                                p_Var10 = &local_12b8;
                                bVar8 = pbrt::ParseArg<int*>
                                                  (&argv_local,&local_ef0,&options.nThreads,
                                                   (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)p_Var10);
                                local_157b = true;
                                if (!bVar8) {
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_f10,"outfile",&local_1563);
                                  local_12d8._M_unused._M_object = (void *)0x0;
                                  local_12d8._8_8_ = 0;
                                  local_12c0 = std::
                                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                               ::_M_invoke;
                                  local_12c8 = std::
                                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                               ::_M_manager;
                                  p_Var10 = &local_12d8;
                                  bVar8 = pbrt::ParseArg<std::__cxx11::string*>
                                                    (&argv_local,&local_f10,&options.imageFile,
                                                     (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)p_Var10);
                                  local_157b = true;
                                  if (!bVar8) {
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_f30,"pixelstats",&local_1564);
                                    local_12f8._M_unused._M_object = (void *)0x0;
                                    local_12f8._8_8_ = 0;
                                    local_12e0 = std::
                                                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                 ::_M_invoke;
                                    local_12e8 = std::
                                                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                 ::_M_manager;
                                    p_Var10 = &local_12f8;
                                    bVar8 = pbrt::ParseArg<bool*>
                                                      (&argv_local,&local_f30,
                                                       &options.recordPixelStatistics,
                                                       (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)p_Var10);
                                    local_157b = true;
                                    if (!bVar8) {
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_f50,"quick",&local_1565);
                                      local_1318._M_unused._M_object = (void *)0x0;
                                      local_1318._8_8_ = 0;
                                      local_1300 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_invoke;
                                      local_1308 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_manager;
                                      p_Var10 = &local_1318;
                                      bVar8 = pbrt::ParseArg<bool*>
                                                        (&argv_local,&local_f50,&options.quickRender
                                                         ,(
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)p_Var10);
                                      local_157b = true;
                                      if (!bVar8) {
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_e30,"quiet",&local_1566);
                                        local_1338._M_unused._M_object = (void *)0x0;
                                        local_1338._8_8_ = 0;
                                        local_1320 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_invoke;
                                        local_1328 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_manager;
                                        p_Var10 = &local_1338;
                                        bVar8 = pbrt::ParseArg<bool*>
                                                          (&argv_local,&local_e30,
                                                           &options.super_BasicPBRTOptions.quiet,
                                                           (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)p_Var10);
                                        local_157b = true;
                                        if (!bVar8) {
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_f70,"render-coord-sys",
                                                     &local_1567);
                                          local_1358._M_unused._M_object = (void *)0x0;
                                          local_1358._8_8_ = 0;
                                          local_1340 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_invoke;
                                          local_1348 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_manager;
                                          p_Var10 = &local_1358;
                                          bVar8 = pbrt::ParseArg<std::__cxx11::string*>
                                                            (&argv_local,&local_f70,&renderCoordSys,
                                                             (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)p_Var10);
                                          local_157b = true;
                                          if (!bVar8) {
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&local_f90,"seed",&local_1568);
                                            local_1378._M_unused._M_object = (void *)0x0;
                                            local_1378._8_8_ = 0;
                                            local_1360 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_invoke;
                                            local_1368 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_manager;
                                            p_Var10 = &local_1378;
                                            bVar8 = pbrt::ParseArg<int*>
                                                              (&argv_local,&local_f90,
                                                               (int *)&options,
                                                               (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)p_Var10);
                                            local_157b = true;
                                            if (!bVar8) {
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_fb0,"spp",&local_1569);
                                              local_1398._M_unused._M_object = (void *)0x0;
                                              local_1398._8_8_ = 0;
                                              local_1380 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_invoke;
                                              local_1388 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_manager;
                                              p_Var10 = &local_1398;
                                              bVar8 = pbrt::ParseArg<pstd::optional<int>*>
                                                                (&argv_local,&local_fb0,
                                                                 &options.pixelSamples,
                                                                 (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)p_Var10);
                                              local_157b = true;
                                              if (!bVar8) {
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&local_fd0,"toply",&local_156a)
                                                ;
                                                local_13b8._M_unused._M_object = (void *)0x0;
                                                local_13b8._8_8_ = 0;
                                                local_13a0 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_invoke;
                                                local_13a8 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_manager;
                                                p_Var10 = &local_13b8;
                                                bVar8 = pbrt::ParseArg<bool*>
                                                                  (&argv_local,&local_fd0,&toPly,
                                                                   (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)p_Var10);
                                                local_157b = true;
                                                if (!bVar8) {
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_ff0,
                                                             "write-partial-images",&local_156b);
                                                  local_13d8._M_unused._M_object = (void *)0x0;
                                                  local_13d8._8_8_ = 0;
                                                  local_13c0 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_invoke;
                                                  local_13c8 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_manager;
                                                  p_Var10 = &local_13d8;
                                                  bVar8 = pbrt::ParseArg<bool*>
                                                                    (&argv_local,&local_ff0,
                                                                     &options.writePartialImages,
                                                                     (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)p_Var10);
                                                  local_157b = true;
                                                  if (!bVar8) {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_1010,"upgrade",
                                                               &local_156c);
                                                    local_13f8._M_unused._M_object = (void *)0x0;
                                                    local_13f8._8_8_ = 0;
                                                    local_13e0 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_invoke;
                                                  local_13e8 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_manager;
                                                  p_Var10 = &local_13f8;
                                                  local_157b = pbrt::ParseArg<bool*>
                                                                         (&argv_local,&local_1010,
                                                                          &options.upgrade,
                                                                          (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)p_Var10);
                                                  std::_Function_base::~_Function_base
                                                            ((_Function_base *)&local_13f8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1010);
                                                  }
                                                  std::_Function_base::~_Function_base
                                                            ((_Function_base *)&local_13d8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_ff0);
                                                }
                                                std::_Function_base::~_Function_base
                                                          ((_Function_base *)&local_13b8);
                                                std::__cxx11::string::~string((string *)&local_fd0);
                                              }
                                              std::_Function_base::~_Function_base
                                                        ((_Function_base *)&local_1398);
                                              std::__cxx11::string::~string((string *)&local_fb0);
                                            }
                                            std::_Function_base::~_Function_base
                                                      ((_Function_base *)&local_1378);
                                            std::__cxx11::string::~string((string *)&local_f90);
                                          }
                                          std::_Function_base::~_Function_base
                                                    ((_Function_base *)&local_1358);
                                          std::__cxx11::string::~string((string *)&local_f70);
                                        }
                                        std::_Function_base::~_Function_base
                                                  ((_Function_base *)&local_1338);
                                        std::__cxx11::string::~string((string *)&local_e30);
                                      }
                                      std::_Function_base::~_Function_base
                                                ((_Function_base *)&local_1318);
                                      std::__cxx11::string::~string((string *)&local_f50);
                                    }
                                    std::_Function_base::~_Function_base
                                              ((_Function_base *)&local_12f8);
                                    std::__cxx11::string::~string((string *)&local_f30);
                                  }
                                  std::_Function_base::~_Function_base
                                            ((_Function_base *)&local_12d8);
                                  std::__cxx11::string::~string((string *)&local_f10);
                                }
                                std::_Function_base::~_Function_base((_Function_base *)&local_12b8);
                                std::__cxx11::string::~string((string *)&local_ef0);
                              }
                              std::_Function_base::~_Function_base((_Function_base *)&local_1298);
                              std::__cxx11::string::~string((string *)&local_ed0);
                            }
                            std::_Function_base::~_Function_base((_Function_base *)&local_1278);
                            std::__cxx11::string::~string((string *)&local_eb0);
                          }
                          std::_Function_base::~_Function_base((_Function_base *)&local_1258);
                          std::__cxx11::string::~string((string *)&local_e90);
                        }
                        std::_Function_base::~_Function_base((_Function_base *)&local_1238);
                        std::__cxx11::string::~string((string *)&local_e70);
                      }
                      std::_Function_base::~_Function_base((_Function_base *)&local_1218);
                      std::__cxx11::string::~string((string *)&local_e50);
                    }
                    std::_Function_base::~_Function_base((_Function_base *)&local_11f8);
                    std::__cxx11::string::~string((string *)local_1418);
                    args = (char **)CONCAT71((int7)((ulong)p_Var10 >> 8),local_157b);
                  }
                  cVar7 = (char)args;
                  std::_Function_base::~_Function_base((_Function_base *)&local_11d8);
                  std::__cxx11::string::~string((string *)local_14f8);
                  std::_Function_base::~_Function_base((_Function_base *)&local_1438);
                  std::__cxx11::string::~string((string *)&c);
                  std::_Function_base::~_Function_base((_Function_base *)&local_1478);
                  std::__cxx11::string::~string((string *)&local_1558);
                  fmt = argv_local;
                  if (cVar7 != '\0') goto LAB_00255784;
                  pcVar12 = *argv_local;
                  iVar9 = strcmp(pcVar12,"--help");
                  if (((iVar9 == 0) || (iVar9 = strcmp(pcVar12,"-help"), iVar9 == 0)) ||
                     ((*pcVar12 == '-' && ((pcVar12[1] == 'h' && (pcVar12[2] == '\0')))))) {
                    local_1558._M_dataplus._M_p = (pointer)&local_1558.field_2;
                    local_1558._M_string_length = 0;
                    local_1558.field_2._M_local_buf[0] = '\0';
                  }
                  else {
                    pbrt::StringPrintf<char*&>
                              (&local_1558,(pbrt *)"argument \"%s\" unknown",(char *)fmt,args);
                  }
                  goto LAB_00256679;
                }
                std::_Function_base::~_Function_base((_Function_base *)&local_1438);
                std::__cxx11::string::~string((string *)&c);
              }
              std::_Function_base::~_Function_base((_Function_base *)&local_1478);
              std::__cxx11::string::~string((string *)&local_1558);
              goto LAB_00255784;
            }
            str_02._M_str = pixelMaterial._M_dataplus._M_p;
            str_02._M_len = pixelMaterial._M_string_length;
            pbrt::SplitStringToInts((vector<int,_std::allocator<int>_> *)&c,str_02,',');
            if ((long)c.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)c.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start == 8) {
              local_1558._M_dataplus._M_p =
                   *(pointer *)
                    c.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
              pstd::optional<pbrt::Point2<int>_>::operator=
                        (&options.pixelMaterial,(Point2<int> *)&local_1558);
              goto LAB_0025577c;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1558,"Didn\'t find two values after --pixelmaterial",
                       (allocator<char> *)local_14f8);
          }
        }
LAB_00256679:
        usage(&local_1558);
        goto LAB_00256683;
      }
      str._M_str = cropWindow._M_dataplus._M_p;
      str._M_len = cropWindow._M_string_length;
      pbrt::SplitStringToFloats(&c,str,',');
      if ((long)c.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)c.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_start != 0x10) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1558,"Didn\'t find four values after --cropwindow",
                   (allocator<char> *)local_14f8);
        goto LAB_00256679;
      }
      local_14f8._0_4_ =
           *c.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start;
      local_14f8._4_4_ =
           c.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start[2];
      local_1418._0_4_ =
           c.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start[1];
      local_1418._4_4_ =
           c.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start[3];
      pbrt::Bounds2<float>::Bounds2
                ((Bounds2<float> *)&local_1558,(Point2<float> *)local_14f8,
                 (Point2<float> *)local_1418);
      pstd::optional<pbrt::Bounds2<float>_>::operator=
                (&options.cropWindow,(Bounds2<float> *)&local_1558);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&c);
LAB_00255784:
      std::__cxx11::string::~string((string *)&pixelMaterial);
      std::__cxx11::string::~string((string *)&pixel);
      std::__cxx11::string::~string((string *)&pixelBounds);
      std::__cxx11::string::~string((string *)&cropWindow);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cropWindow,pcVar12,(allocator<char> *)&pixelBounds);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filenames,
                 &cropWindow);
      std::__cxx11::string::~string((string *)&cropWindow);
      argv_local = argv_local + 1;
    }
  }
  if ((((options.super_BasicPBRTOptions.quiet == false) && (format == false)) && (toPly == false))
     && (options.upgrade == false)) {
    printf("pbrt version 4 (built %s at %s)\n","May  3 2025","00:00:37");
    puts("Copyright (c)1998-2020 Matt Pharr, Wenzel Jakob, and Greg Humphreys.");
    puts(
        "The source code to pbrt (but *not* the book contents) is covered by the Apache 2.0 License."
        );
    puts("See the file LICENSE.txt for the conditions of the license.");
    fflush(_stdout);
  }
  bVar8 = std::operator==(&renderCoordSys,"camera");
  uStack_1590 = 0;
  if (!bVar8) {
    bVar8 = std::operator==(&renderCoordSys,"cameraworld");
    if (bVar8) {
      uStack_1590 = 1;
    }
    else {
      bVar8 = std::operator==(&renderCoordSys,"world");
      if (!bVar8) {
        pbrt::ErrorExit<std::__cxx11::string&>
                  ("%s: unknown rendering coordinate system.",&renderCoordSys);
      }
      uStack_1590 = 2;
    }
  }
  options.super_BasicPBRTOptions.renderingSpace = (RenderingCoordinateSystem)uStack_1590;
  if (options.mseReferenceImage._M_string_length == 0) {
    if (options.mseReferenceOutput._M_string_length != 0) {
LAB_00256683:
      pcVar12 = "Must provide MSE reference image via --mse-reference-image";
      goto LAB_0025668a;
    }
  }
  else if (options.mseReferenceOutput._M_string_length == 0) {
    pcVar12 = "Must provide MSE reference output filename via --mse-reference-out";
LAB_0025668a:
    pbrt::ErrorExit<>(pcVar12);
  }
  if ((options.pixelMaterial.set == true) && (options.super_BasicPBRTOptions.useGPU == true)) {
    pbrt::Warning<>("Disabling --use-gpu since --pixelmaterial was specified.");
    options.super_BasicPBRTOptions.useGPU = false;
  }
  options.logLevel = pbrt::LogLevelFromString(&logLevel);
  pbrt::InitPBRT(&options);
  if (format == true) {
    uVar11 = (ulong)options.upgrade;
  }
  else {
    uVar11 = CONCAT71((int7)((ulong)uStack_1590 >> 8),options.upgrade);
    if (((toPly & 1U) == 0) && ((options._44_2_ & 0x100) == 0)) {
      pbrt::ParsedScene::ParsedScene((ParsedScene *)&cropWindow);
      filenames_01.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)filenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)filenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5);
      filenames_01.n = uVar11;
      pbrt::ParseFiles((pbrt *)&cropWindow,
                       (SceneRepresentation *)
                       filenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,filenames_01);
      if (options.super_BasicPBRTOptions.useGPU == true) {
        pbrt::ErrorExit<>("GPU rendering is not supported on this system.");
      }
      pbrt::CPURender((ParsedScene *)&cropWindow);
      if (pbrt::LOGGING_LogLevel < 1) {
        pixelBounds._M_dataplus._M_p = (pointer)pbrt::GetCurrentRSS();
        pbrt::Log<unsigned_long>
                  (Verbose,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp"
                   ,0x101,"Memory used after post-render cleanup: %s",(unsigned_long *)&pixelBounds)
        ;
      }
      pbrt::CleanupPBRT();
      pbrt::ParsedScene::~ParsedScene((ParsedScene *)&cropWindow);
      goto LAB_00256537;
    }
  }
  local_de0.memoryResource = (memory_resource *)&local_df0;
  cropWindow._M_dataplus._M_p = (pointer)&PTR_Scale_02db57f8;
  cropWindow._M_string_length = (cropWindow._M_string_length >> 8 & 0xffffff) << 8;
  cropWindow.field_2._M_local_buf[0] = toPly;
  cropWindow.field_2._M_local_buf[1] = (char)uVar11;
  local_df0._M_allocated_capacity._0_4_ = 0;
  local_df0._8_8_ = 0;
  local_dd0._0_8_ = (ParsedParameter *)0x0;
  local_dd0._32_8_ = local_dd0 + 0x10;
  local_d90._16_8_ = local_d90;
  local_dd0._16_4_ = _S_red;
  local_dd0._24_8_ = (ParsedParameter *)0x0;
  local_dd0._48_8_ = (ParsedParameter *)0x0;
  local_d90._0_4_ = _S_red;
  local_d90._8_8_ = (_Base_ptr)0x0;
  local_d90._32_8_ = (char *)0x0;
  local_d60._16_8_ = local_d60;
  local_d60._0_4_ = _S_red;
  local_d60._8_8_ = (_Base_ptr)0x0;
  local_d40.memoryResource = (memory_resource *)0x0;
  filenames_00.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)filenames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)filenames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5);
  filenames_00.n = local_d60._16_8_;
  local_dd8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_de0.memoryResource;
  local_dd0._40_8_ = local_dd0._32_8_;
  local_d90._24_8_ = local_d90._16_8_;
  local_d60._24_8_ = local_d60._16_8_;
  pbrt::ParseFiles((pbrt *)&cropWindow,
                   (SceneRepresentation *)
                   filenames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,filenames_00);
  pbrt::FormattingScene::~FormattingScene((FormattingScene *)&cropWindow);
LAB_00256537:
  std::__cxx11::string::~string((string *)&renderCoordSys);
  std::__cxx11::string::~string((string *)&logLevel);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&filenames);
  pbrt::PBRTOptions::~PBRTOptions(&options);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
#ifdef NVTX
#ifdef PBRT_IS_WINDOWS
    nvtxNameOsThread(GetCurrentThreadId(), "MAIN_THREAD");
#else
    nvtxNameOsThread(syscall(SYS_gettid), "MAIN_THREAD");
#endif
#endif  // NVTX

    // Declare variables for parsed command line
    PBRTOptions options;
    std::vector<std::string> filenames;
    std::string logLevel = "error";
    std::string renderCoordSys = "cameraworld";
    bool format = false, toPly = false;

    // Process command-line arguments
    ++argv;
    while (*argv != nullptr) {
        if ((*argv)[0] != '-') {
            filenames.push_back(*argv);
            ++argv;
            continue;
        }

        auto onError = [](const std::string &err) {
            usage(err);
            exit(1);
        };

        std::string cropWindow, pixelBounds, pixel, pixelMaterial;
        if (ParseArg(&argv, "cropwindow", &cropWindow, onError)) {
            std::vector<Float> c = SplitStringToFloats(cropWindow, ',');
            if (c.size() != 4) {
                usage("Didn't find four values after --cropwindow");
                return 1;
            }
            options.cropWindow = Bounds2f(Point2f(c[0], c[2]), Point2f(c[1], c[3]));
        } else if (ParseArg(&argv, "pixel", &pixel, onError)) {
            std::vector<int> p = SplitStringToInts(pixel, ',');
            if (p.size() != 2) {
                usage("Didn't find two values after --pixel");
                return 1;
            }
            options.pixelBounds =
                Bounds2i(Point2i(p[0], p[1]), Point2i(p[0] + 1, p[1] + 1));
        } else if (ParseArg(&argv, "pixelbounds", &pixelBounds, onError)) {
            std::vector<int> p = SplitStringToInts(pixelBounds, ',');
            if (p.size() != 4) {
                usage("Didn't find four integer values after --pixelbounds");
                return 1;
            }
            options.pixelBounds = Bounds2i(Point2i(p[0], p[2]), Point2i(p[1], p[3]));
        } else if (ParseArg(&argv, "pixelmaterial", &pixelMaterial, onError)) {
            std::vector<int> p = SplitStringToInts(pixelMaterial, ',');
            if (p.size() != 2) {
                usage("Didn't find two values after --pixelmaterial");
                return 1;
            }
            options.pixelMaterial = Point2i(p[0], p[1]);
        } else if (
#ifdef PBRT_BUILD_GPU_RENDERER
            ParseArg(&argv, "gpu", &options.useGPU, onError) ||
            ParseArg(&argv, "gpu-device", &options.gpuDevice, onError) ||
#endif
            ParseArg(&argv, "debugstart", &options.debugStart, onError) ||
            ParseArg(&argv, "disable-pixel-jitter", &options.disablePixelJitter,
                     onError) ||
            ParseArg(&argv, "disable-wavelength-jitter", &options.disableWavelengthJitter,
                     onError) ||
            ParseArg(&argv, "display-server", &options.displayServer, onError) ||
            ParseArg(&argv, "force-diffuse", &options.forceDiffuse, onError) ||
            ParseArg(&argv, "format", &format, onError) ||
            ParseArg(&argv, "log-level", &logLevel, onError) ||
            ParseArg(&argv, "mse-reference-image", &options.mseReferenceImage, onError) ||
            ParseArg(&argv, "mse-reference-out", &options.mseReferenceOutput, onError) ||
            ParseArg(&argv, "nthreads", &options.nThreads, onError) ||
            ParseArg(&argv, "outfile", &options.imageFile, onError) ||
            ParseArg(&argv, "pixelstats", &options.recordPixelStatistics, onError) ||
            ParseArg(&argv, "quick", &options.quickRender, onError) ||
            ParseArg(&argv, "quiet", &options.quiet, onError) ||
            ParseArg(&argv, "render-coord-sys", &renderCoordSys, onError) ||
            ParseArg(&argv, "seed", &options.seed, onError) ||
            ParseArg(&argv, "spp", &options.pixelSamples, onError) ||
            ParseArg(&argv, "toply", &toPly, onError) ||
            ParseArg(&argv, "write-partial-images", &options.writePartialImages,
                     onError) ||
            ParseArg(&argv, "upgrade", &options.upgrade, onError)) {
            // success
        } else if ((strcmp(*argv, "--help") == 0) || (strcmp(*argv, "-help") == 0) ||
                   (strcmp(*argv, "-h") == 0)) {
            usage();
            return 0;
        } else {
            usage(StringPrintf("argument \"%s\" unknown", *argv));
            return 1;
        }
    }

    // Print welcome banner
    if (!options.quiet && !format && !toPly && !options.upgrade) {
        printf("pbrt version 4 (built %s at %s)\n", __DATE__, __TIME__);
#ifdef PBRT_DEBUG_BUILD
        LOG_VERBOSE("Running debug build");
        printf("*** DEBUG BUILD ***\n");
#endif
        printf("Copyright (c)1998-2020 Matt Pharr, Wenzel Jakob, and Greg Humphreys.\n");
        printf("The source code to pbrt (but *not* the book contents) is covered "
               "by the Apache 2.0 License.\n");
        printf("See the file LICENSE.txt for the conditions of the license.\n");
        fflush(stdout);
    }

    // Check validity of provided arguments
    if (renderCoordSys == "camera")
        options.renderingSpace = RenderingCoordinateSystem::Camera;
    else if (renderCoordSys == "cameraworld")
        options.renderingSpace = RenderingCoordinateSystem::CameraWorld;
    else if (renderCoordSys == "world")
        options.renderingSpace = RenderingCoordinateSystem::World;
    else
        ErrorExit("%s: unknown rendering coordinate system.", renderCoordSys);

    if (!options.mseReferenceImage.empty() && options.mseReferenceOutput.empty())
        ErrorExit("Must provide MSE reference output filename via "
                  "--mse-reference-out");
    if (!options.mseReferenceOutput.empty() && options.mseReferenceImage.empty())
        ErrorExit("Must provide MSE reference image via --mse-reference-image");

    if (options.pixelMaterial && options.useGPU) {
        Warning("Disabling --use-gpu since --pixelmaterial was specified.");
        options.useGPU = false;
    }

    options.logLevel = LogLevelFromString(logLevel);

    // Initialize pbrt
    InitPBRT(options);

    if (format || toPly || options.upgrade) {
        FormattingScene formattingScene(toPly, options.upgrade);
        ParseFiles(&formattingScene, filenames);
    } else {
        // Parse provided scene description files
        ParsedScene scene;
        ParseFiles(&scene, filenames);

        // Render the scene
        if (options.useGPU)
            GPURender(scene);
        else
            CPURender(scene);

        LOG_VERBOSE("Memory used after post-render cleanup: %s", GetCurrentRSS());
        // Clean up after rendering the scene
        CleanupPBRT();
    }
    return 0;
}